

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

interresult __thiscall tetgenmesh::finddirection(tetgenmesh *this,triface *searchtet,point endpt)

{
  tetrahedron pa;
  tetrahedron pc;
  undefined1 auVar1 [16];
  tetrahedron *pppdVar2;
  long lVar3;
  int *piVar4;
  undefined4 *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  tetrahedron ppdVar10;
  tetrahedron pc_00;
  bool bVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pppdVar2 = searchtet->tet;
  pa = pppdVar2[orgpivot[searchtet->ver]];
  if (pppdVar2[7] == (tetrahedron)this->dummypoint) {
    ppdVar10 = pppdVar2[3];
    searchtet->ver = (uint)ppdVar10 & 0xf;
    pppdVar2 = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
    searchtet->tet = pppdVar2;
    if (pppdVar2[4] == pa) {
      iVar6 = 0xb;
    }
    else if (pppdVar2[5] == pa) {
      iVar6 = 3;
    }
    else {
      iVar6 = 7;
      if (pppdVar2[6] != pa) {
        iVar6 = 0;
      }
    }
    searchtet->ver = iVar6;
  }
  iVar6 = searchtet->ver;
  ppdVar10 = searchtet->tet[destpivot[iVar6]];
  if (ppdVar10 != (tetrahedron)endpt) {
    pc_00 = searchtet->tet[apexpivot[iVar6]];
    if (pc_00 == (tetrahedron)endpt) {
      iVar6 = eprevesymtbl[iVar6];
    }
    else {
      pppdVar2 = searchtet->tet;
      lVar3 = (long)searchtet->ver;
      while (pc = pppdVar2[oppopivot[lVar3]], pc != (tetrahedron)endpt) {
        if (pc == (tetrahedron)this->dummypoint) {
          if (this->nonconvex != 0) {
            return ACROSSFACE;
          }
          puVar5 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar5 = 2;
          __cxa_throw(puVar5,&int::typeinfo,0);
        }
        dVar13 = orient3d((double *)pa,(double *)ppdVar10,(double *)pc_00,endpt);
        dVar14 = orient3d((double *)ppdVar10,(double *)pa,(double *)pc,endpt);
        dVar15 = orient3d((double *)pa,(double *)pc_00,(double *)pc,endpt);
        if (dVar13 <= 0.0) {
          if (dVar14 <= 0.0) {
            if (dVar15 <= 0.0) {
              if ((dVar13 != 0.0) || (NAN(dVar13))) {
                if ((dVar14 == 0.0) && (!NAN(dVar14))) {
                  iVar6 = esymtbl[searchtet->ver];
                  searchtet->ver = iVar6;
                  searchtet->ver = enexttbl[iVar6];
                  return ACROSSEDGE - (dVar15 == 0.0);
                }
                if ((dVar15 != 0.0) || (NAN(dVar15))) {
                  return ACROSSFACE;
                }
                searchtet->ver = eprevesymtbl[searchtet->ver];
              }
              else {
                if ((dVar14 == 0.0) && (!NAN(dVar14))) {
                  return ACROSSVERT;
                }
                if ((dVar15 == 0.0) && (!NAN(dVar15))) {
                  searchtet->ver = eprevesymtbl[searchtet->ver];
                  return ACROSSVERT;
                }
              }
              return ACROSSEDGE;
            }
LAB_0012abbb:
            bVar11 = true;
LAB_0012abbd:
            bVar12 = false;
          }
          else {
            if (dVar15 <= 0.0) {
LAB_0012abc1:
              bVar12 = true;
              goto LAB_0012ac0a;
            }
            uVar8 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
            this->randomseed = uVar8;
            bVar12 = (bool)((byte)uVar8 & 1);
            bVar11 = (uVar8 & 1) == 0;
          }
        }
        else {
          if (dVar14 <= 0.0) {
            if (0.0 < dVar15) {
              uVar8 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
              this->randomseed = uVar8;
              bVar11 = (uVar8 & 1) == 0;
              goto LAB_0012abbd;
            }
LAB_0012abc5:
            bVar12 = false;
          }
          else {
            if (0.0 < dVar15) {
              uVar8 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = uVar8;
              this->randomseed = uVar8;
              iVar6 = (int)uVar8 + SUB164(auVar1 * ZEXT816(0x5555555555555556),8) * -3;
              if (iVar6 != 0) {
                if (iVar6 == 1) goto LAB_0012abc1;
                goto LAB_0012abbb;
              }
              goto LAB_0012abc5;
            }
            uVar8 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
            this->randomseed = uVar8;
            bVar12 = (uVar8 & 1) == 0;
          }
LAB_0012ac0a:
          bVar11 = false;
        }
        uVar9 = searchtet->ver;
        if (bVar12 == false) {
          if (bVar11) {
            iVar6 = eprevtbl[(int)uVar9];
            searchtet->ver = iVar6;
            ppdVar10 = searchtet->tet[facepivot1[iVar6]];
            uVar9 = (uint)ppdVar10 & 0xf;
            searchtet->ver = uVar9;
            searchtet->tet = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
            iVar6 = facepivot2[iVar6][uVar9];
          }
          else {
            ppdVar10 = searchtet->tet[uVar9 & 3];
            uVar7 = (uint)ppdVar10 & 0xf;
            searchtet->ver = uVar7;
            searchtet->tet = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
            iVar6 = fsymtbl[(int)uVar9][uVar7];
          }
          searchtet->ver = iVar6;
          piVar4 = enexttbl + iVar6;
        }
        else {
          ppdVar10 = searchtet->tet[facepivot1[(int)uVar9]];
          uVar7 = (uint)ppdVar10 & 0xf;
          searchtet->ver = uVar7;
          searchtet->tet = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
          piVar4 = facepivot2[(int)uVar9] + uVar7;
        }
        lVar3 = (long)*piVar4;
        searchtet->ver = *piVar4;
        pppdVar2 = searchtet->tet;
        ppdVar10 = pppdVar2[destpivot[lVar3]];
        pc_00 = pppdVar2[apexpivot[lVar3]];
      }
      iVar6 = esymtbl[lVar3];
      searchtet->ver = iVar6;
      iVar6 = enexttbl[iVar6];
    }
    searchtet->ver = iVar6;
  }
  return ACROSSVERT;
}

Assistant:

enum tetgenmesh::interresult 
  tetgenmesh::finddirection(triface* searchtet, point endpt)
{
  triface neightet;
  point pa, pb, pc, pd;
  enum {HMOVE, RMOVE, LMOVE} nextmove;
  REAL hori, rori, lori;
  int t1ver;
  int s;

  // The origin is fixed.
  pa = org(*searchtet);
  if ((point) searchtet->tet[7] == dummypoint) {
    // A hull tet. Choose the neighbor of its base face.
    decode(searchtet->tet[3], *searchtet);
    // Reset the origin to be pa.
    if ((point) searchtet->tet[4] == pa) {
      searchtet->ver = 11;
    } else if ((point) searchtet->tet[5] == pa) {
      searchtet->ver = 3;
    } else if ((point) searchtet->tet[6] == pa) {
      searchtet->ver = 7;
    } else {
      searchtet->ver = 0;
    }
  }

  pb = dest(*searchtet);
  // Check whether the destination or apex is 'endpt'.
  if (pb == endpt) {
    // pa->pb is the search edge.
    return ACROSSVERT;
  }

  pc = apex(*searchtet);
  if (pc == endpt) {
    // pa->pc is the search edge.
    eprevesymself(*searchtet);
    return ACROSSVERT;
  }

  // Walk through tets around pa until the right one is found.
  while (1) {

    pd = oppo(*searchtet);
    // Check whether the opposite vertex is 'endpt'.
    if (pd == endpt) {
      // pa->pd is the search edge.
      esymself(*searchtet);
      enextself(*searchtet);
      return ACROSSVERT;
    }
    // Check if we have entered outside of the domain.
    if (pd == dummypoint) {
      // This is possible when the mesh is non-convex.
      if (nonconvex) {
        return ACROSSFACE; // return ACROSSSUB; // Hit a bounday.
      } else {
        terminatetetgen(this, 2);
      }
    }

    // Now assume that the base face abc coincides with the horizon plane,
    //   and d lies above the horizon.  The search point 'endpt' may lie
    //   above or below the horizon.  We test the orientations of 'endpt'
    //   with respect to three planes: abc (horizon), bad (right plane),
    //   and acd (left plane). 
    hori = orient3d(pa, pb, pc, endpt);
    rori = orient3d(pb, pa, pd, endpt);
    lori = orient3d(pa, pc, pd, endpt);

    // Now decide the tet to move.  It is possible there are more than one
    //   tets are viable moves. Is so, randomly choose one. 
    if (hori > 0) {
      if (rori > 0) {
        if (lori > 0) {
          // Any of the three neighbors is a viable move.
          s = randomnation(3); 
          if (s == 0) {
            nextmove = HMOVE;
          } else if (s == 1) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // Two tets, below horizon and below right, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = RMOVE;
          }
        }
      } else {
        if (lori > 0) {
          // Two tets, below horizon and below left, are viable.
          if (randomnation(2)) {
            nextmove = HMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below horizon is chosen.
          nextmove = HMOVE;
        }
      }
    } else {
      if (rori > 0) {
        if (lori > 0) {
          // Two tets, below right and below left, are viable.
          if (randomnation(2)) {
            nextmove = RMOVE;
          } else {
            nextmove = LMOVE;
          }
        } else {
          // The tet below right is chosen.
          nextmove = RMOVE;
        }
      } else {
        if (lori > 0) {
          // The tet below left is chosen.
          nextmove = LMOVE;
        } else {
          // 'endpt' lies either on the plane(s) or across face bcd.
          if (hori == 0) {
            if (rori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pb.
              return ACROSSVERT;
            }
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pc.
              eprevesymself(*searchtet); // [a,c,d]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pc.
            return ACROSSEDGE;
          }
          if (rori == 0) {
            if (lori == 0) {
              // pa->'endpt' is COLLINEAR with pa->pd.
              esymself(*searchtet); // face bad.
              enextself(*searchtet); // face [a,d,b]
              return ACROSSVERT;
            }
            // pa->'endpt' crosses the edge pb->pd.
            esymself(*searchtet); // face bad.
            enextself(*searchtet); // face adb
            return ACROSSEDGE;
          }
          if (lori == 0) {
            // pa->'endpt' crosses the edge pc->pd.
            eprevesymself(*searchtet); // [a,c,d]
            return ACROSSEDGE;
          }
          // pa->'endpt' crosses the face bcd.
          return ACROSSFACE;
        }
      }
    }

    // Move to the next tet, fix pa as its origin.
    if (nextmove == RMOVE) {
      fnextself(*searchtet);
    } else if (nextmove == LMOVE) {
      eprevself(*searchtet);
      fnextself(*searchtet);
      enextself(*searchtet);
    } else { // HMOVE
      fsymself(*searchtet);
      enextself(*searchtet);
    }
    pb = dest(*searchtet);
    pc = apex(*searchtet);

  } // while (1)

}